

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestInterface.cpp
# Opt level: O2

void RunUtilityTests(void)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  int iVar4;
  bool bVar5;
  FastVector<unsigned_int,_false,_false> arr;
  FastVector<unsigned_int,_false,_false> local_48;
  uint local_2c;
  
  if (Tests::messageVerbose == '\x01') {
    puts("FastVector test 1\r");
  }
  testsCount[3] = testsCount[3] + 1;
  local_48.data = (uint *)0x0;
  local_48.max = 0;
  local_48.count = 0;
  local_2c = 1;
  FastVector<unsigned_int,_false,_false>::push_back(&local_48,&local_2c);
  iVar4 = 0x400;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    puVar3 = FastVector<unsigned_int,_false,_false>::operator[](&local_48,local_48.count - 1);
    FastVector<unsigned_int,_false,_false>::push_back(&local_48,puVar3);
    puVar3 = FastVector<unsigned_int,_false,_false>::back(&local_48);
    *puVar3 = *puVar3 + 1;
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0x400) {
      testsPassed[3] = testsPassed[3] + 1;
      FastVector<unsigned_int,_false,_false>::~FastVector(&local_48);
      goto LAB_00167833;
    }
    puVar3 = FastVector<unsigned_int,_false,_false>::operator[](&local_48,uVar2);
    uVar1 = *puVar3;
  } while (*puVar3 == uVar2 + 1);
  if (Tests::messageVerbose == '\0') {
    puts("FastVector test 1\r");
  }
  puVar3 = FastVector<unsigned_int,_false,_false>::operator[](&local_48,uVar2);
  printf("Failed %d != %d\n",(ulong)*puVar3,(ulong)(uVar2 + 1));
  FastVector<unsigned_int,_false,_false>::~FastVector(&local_48);
  if (0x3ff < uVar2) {
LAB_00167833:
    if (Tests::messageVerbose == '\x01') {
      puts("FastVector test 2\r");
    }
    testsCount[3] = testsCount[3] + 1;
    local_48.data = (uint *)0x0;
    local_48.max = 0;
    local_48.count = 0;
    local_2c = 1;
    FastVector<unsigned_int,_false,_false>::push_back(&local_48,&local_2c);
    iVar4 = 0x400;
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      puVar3 = FastVector<unsigned_int,_false,_false>::operator[](&local_48,local_48.count - 1);
      FastVector<unsigned_int,_false,_false>::push_back(&local_48,puVar3);
      puVar3 = FastVector<unsigned_int,_false,_false>::back(&local_48);
      *puVar3 = *puVar3 + 1;
    }
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      if (uVar2 == 0x400) {
        testsPassed[3] = testsPassed[3] + 1;
        goto LAB_001678f0;
      }
      puVar3 = FastVector<unsigned_int,_false,_false>::operator[](&local_48,uVar2);
      uVar1 = *puVar3;
    } while (*puVar3 == uVar2 + 1);
    if (Tests::messageVerbose == '\0') {
      puts("FastVector test 2\r");
    }
    puVar3 = FastVector<unsigned_int,_false,_false>::operator[](&local_48,uVar2);
    printf("Failed %d != %d\n",(ulong)*puVar3,(ulong)(uVar2 + 1));
LAB_001678f0:
    FastVector<unsigned_int,_false,_false>::~FastVector(&local_48);
  }
  return;
}

Assistant:

void RunUtilityTests()
{
	{
		if(Tests::messageVerbose)
			printf("FastVector test 1\r\n");

		testsCount[TEST_TYPE_EXTRA]++;

		FastVector<unsigned> arr;

		arr.push_back(1);

		for(unsigned i = 0; i < 1024; i++)
		{
			arr.push_back(arr[arr.size() - 1]);
			arr.back()++;
		}

		for(unsigned i = 0; i < 1024; i++)
		{
			if(arr[i] != i + 1)
			{
				if(!Tests::messageVerbose)
					printf("FastVector test 1\r\n");

				printf("Failed %d != %d\n", arr[i], i + 1);
				return;
			}
		}

		testsPassed[TEST_TYPE_EXTRA]++;
	}

	{
		if(Tests::messageVerbose)
			printf("FastVector test 2\r\n");

		testsCount[TEST_TYPE_EXTRA]++;

		FastVector<unsigned> arr;

		arr.push_back(1);

		for(unsigned i = 0; i < 1024; i++)
		{
			arr.push_back(arr[arr.size() - 1]);
			arr.back()++;
		}

		for(unsigned i = 0; i < 1024; i++)
		{
			if(arr[i] != i + 1)
			{
				if(!Tests::messageVerbose)
					printf("FastVector test 2\r\n");

				printf("Failed %d != %d\n", arr[i], i + 1);
				return;
			}
		}

		testsPassed[TEST_TYPE_EXTRA]++;
	}
}